

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

int isobusfs_recv_err(int sock,isobusfs_err_msg *emsg)

{
  uint __errnum;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  long *in_RSI;
  int in_EDI;
  bool bVar4;
  msghdr msg;
  int ret;
  cmsghdr *cm;
  char control [200];
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar5;
  isobusfs_err_msg *emsg_00;
  isobusfs_err_msg *emsg_01;
  cmsghdr *local_e0;
  cmsghdr local_d8 [12];
  long *local_10;
  uint local_4;
  
  emsg_00 = (isobusfs_err_msg *)0x0;
  emsg_01 = (isobusfs_err_msg *)0x0;
  local_e0 = local_d8;
  local_10 = in_RSI;
  sVar1 = recvmsg(in_EDI,(msghdr *)&stack0xfffffffffffffee0,0x2040);
  if ((int)sVar1 == -1) {
    piVar2 = __errno_location();
    __errnum = -*piVar2;
    uVar5 = __errnum;
    pcVar3 = strerror(__errnum);
    isobusfs_log(LOG_LEVEL_ERROR,"recvmsg error notification: %i (%s)",(ulong)uVar5,pcVar3);
    local_4 = __errnum;
  }
  else {
    *local_10 = 0;
    local_10[1] = 0;
    while( true ) {
      bVar4 = false;
      if (local_e0 != (cmsghdr *)0x0) {
        bVar4 = local_e0->cmsg_len != 0;
      }
      if (!bVar4) {
        return 0;
      }
      isobusfs_parse_cm(emsg_00,(cmsghdr *)
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if ((*local_10 != 0) && (local_10[1] != 0)) break;
      local_e0 = __cmsg_nxthdr((msghdr *)&stack0xfffffffffffffee0,local_e0);
    }
    local_4 = isobusfs_extract_serr(emsg_01);
  }
  return local_4;
}

Assistant:

int isobusfs_recv_err(int sock, struct isobusfs_err_msg *emsg)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(sock, &msg, MSG_ERRQUEUE | MSG_DONTWAIT);
	if (ret == -1) {
		ret = -errno;
		pr_err("recvmsg error notification: %i (%s)", ret, strerror(ret));
		return ret;
	}

	if (msg.msg_flags & MSG_CTRUNC) {
		pr_err("recvmsg error notification: truncated");
		return -EINVAL;
	}

	emsg->serr = NULL;
	emsg->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		isobusfs_parse_cm(emsg, cm);
		if (emsg->serr && emsg->tss)
			return isobusfs_extract_serr(emsg);
	}

	return 0;
}